

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

OPJ_SIZE_T opj_read_from_buffer(void *pdst,OPJ_SIZE_T len,opj_buffer_info_t *psrc)

{
  OPJ_BYTE *local_28;
  OPJ_SIZE_T n;
  opj_buffer_info_t *psrc_local;
  OPJ_SIZE_T len_local;
  void *pdst_local;
  
  local_28 = psrc->buf + (psrc->len - (long)psrc->cur);
  if (local_28 == (OPJ_BYTE *)0x0) {
    local_28 = (OPJ_BYTE *)0xffffffffffffffff;
  }
  else {
    if (len < local_28) {
      local_28 = (OPJ_BYTE *)len;
    }
    memcpy(pdst,psrc->cur,(size_t)local_28);
    psrc->cur = psrc->cur + (long)local_28;
  }
  return (OPJ_SIZE_T)local_28;
}

Assistant:

static OPJ_SIZE_T
opj_read_from_buffer (void* pdst, OPJ_SIZE_T len, opj_buffer_info_t* psrc)
{
    OPJ_SIZE_T n = psrc->buf + psrc->len - psrc->cur;

    if (n) {
        if (n > len)
            n = len;

        memcpy (pdst, psrc->cur, n);
        psrc->cur += n;
    }
    else
        n = (OPJ_SIZE_T)-1;

    return n;
}